

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::ZoneVectorBase::_resize
          (ZoneVectorBase *this,ZoneAllocator *allocator,uint32_t sizeOfT,uint32_t n)

{
  uint uVar1;
  Error EVar2;
  
  uVar1 = this->_size;
  if (this->_capacity < n) {
    EVar2 = _grow(this,allocator,sizeOfT,n - uVar1);
    if (EVar2 != 0) {
      return 1;
    }
    if (this->_capacity < n) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/zonevector.cpp"
                 ,0x80,"_capacity >= n");
    }
  }
  if (uVar1 < n) {
    memset((void *)((ulong)uVar1 * (ulong)sizeOfT + (long)this->_data),0,
           (ulong)(n - uVar1) * (ulong)sizeOfT);
  }
  this->_size = n;
  return 0;
}

Assistant:

Error ZoneVectorBase::_resize(ZoneAllocator* allocator, uint32_t sizeOfT, uint32_t n) noexcept {
  uint32_t size = _size;

  if (_capacity < n) {
    ASMJIT_PROPAGATE(_grow(allocator, sizeOfT, n - size));
    ASMJIT_ASSERT(_capacity >= n);
  }

  if (size < n)
    memset(static_cast<uint8_t*>(_data) + size_t(size) * sizeOfT, 0, size_t(n - size) * sizeOfT);

  _size = n;
  return kErrorOk;
}